

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O1

bool __thiscall IR::PropertySymOpnd::NeedsCheckFixedFieldTypeCheck(PropertySymOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     ((bVar2 = IsTypeCheckSeqCandidate(this), !bVar2 && (((ushort)this->field_12 & 2) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x483,"(MayNeedTypeCheckProtection())","MayNeedTypeCheckProtection()");
    if (!bVar2) goto LAB_00495fde;
    *puVar3 = 0;
  }
  bVar2 = IsTypeCheckSeqCandidate(this);
  if ((!bVar2) && (((this->field_12).field_0.field_5.typeCheckSeqFlags & 0x4e) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x484,"(TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "TypeCheckSeqBitsSetOnlyIfCandidate()");
    if (!bVar2) {
LAB_00495fde:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((((ushort)this->field_12 & 1) == 0) && (bVar2 = NeedsPrimaryTypeCheck(this), !bVar2)) &&
     (((ushort)this->field_12 & 2) != 0)) {
    if (((this->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) {
      return true;
    }
    bVar2 = NeedsWriteGuardTypeCheck(this);
    return bVar2;
  }
  return false;
}

Assistant:

bool NeedsCheckFixedFieldTypeCheck() const
    {
        Assert(MayNeedTypeCheckProtection());
        Assert(TypeCheckSeqBitsSetOnlyIfCandidate());
        return !IsTypeCheckOnly() && !NeedsPrimaryTypeCheck() && UsesFixedValue() && (!IsTypeChecked() || NeedsWriteGuardTypeCheck());
    }